

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xatlas.cpp
# Opt level: O0

Vector3 __thiscall xatlas::internal::Mesh::computeFaceCenter(Mesh *this,uint32_t face)

{
  Array<xatlas::internal::Vector3> *this_00;
  uint *puVar1;
  Array<unsigned_int> *this_01;
  Vector3 VVar2;
  Vector3 local_1e0;
  Vector3 local_1d0;
  Vector3 local_1c0;
  Vector3 local_1b0;
  Vector3 local_1a0;
  Vector3 local_190;
  Vector3 local_180;
  undefined1 local_170 [8];
  Vector3 m2;
  float fStack_15c;
  float local_158;
  Vector3 local_150;
  Vector3 local_140;
  Vector3 local_130;
  Vector3 local_120;
  undefined1 local_110 [8];
  Vector3 m1;
  float fStack_fc;
  float local_f8;
  Vector3 local_f0;
  Vector3 local_e0;
  Vector3 local_d0;
  Vector3 local_c0;
  undefined1 local_b0 [8];
  Vector3 m0;
  float fStack_9c;
  float local_98;
  Vector3 local_90;
  float local_84;
  float fStack_80;
  float l2;
  float local_78;
  Vector3 local_70;
  float local_64;
  float fStack_60;
  float l1;
  float local_58;
  Vector3 local_50;
  float local_44;
  Vector3 *pVStack_40;
  float l0;
  Vector3 *p2;
  Vector3 *p1;
  Vector3 *p0;
  Mesh *pMStack_20;
  uint32_t face_local;
  Mesh *this_local;
  
  this_00 = &this->m_positions;
  this_01 = &this->m_indices;
  p0._4_4_ = face;
  pMStack_20 = this;
  puVar1 = Array<unsigned_int>::operator[](this_01,face * 3);
  p1 = Array<xatlas::internal::Vector3>::operator[](this_00,*puVar1);
  puVar1 = Array<unsigned_int>::operator[](this_01,p0._4_4_ * 3 + 1);
  p2 = Array<xatlas::internal::Vector3>::operator[](this_00,*puVar1);
  puVar1 = Array<unsigned_int>::operator[](this_01,p0._4_4_ * 3 + 2);
  pVStack_40 = Array<xatlas::internal::Vector3>::operator[](this_00,*puVar1);
  VVar2 = operator-(p2,p1);
  local_58 = VVar2.z;
  local_50.z = local_58;
  _fStack_60 = VVar2._0_8_;
  local_50.x = fStack_60;
  local_50.y = l1;
  _fStack_60 = VVar2;
  local_44 = internal::length(&local_50);
  VVar2 = operator-(pVStack_40,p2);
  local_78 = VVar2.z;
  local_70.z = local_78;
  _fStack_80 = VVar2._0_8_;
  local_70.x = fStack_80;
  local_70.y = l2;
  _fStack_80 = VVar2;
  local_64 = internal::length(&local_70);
  VVar2 = operator-(p1,pVStack_40);
  local_98 = VVar2.z;
  local_90.z = local_98;
  stack0xffffffffffffff60 = VVar2._0_8_;
  local_90.x = m0.z;
  local_90.y = fStack_9c;
  unique0x1000026f = VVar2;
  local_84 = internal::length(&local_90);
  VVar2 = operator+(p1,p2);
  local_e0.z = VVar2.z;
  local_d0.z = local_e0.z;
  local_e0._0_8_ = VVar2._0_8_;
  local_d0.x = local_e0.x;
  local_d0.y = local_e0.y;
  VVar2 = operator*(&local_d0,local_44);
  local_f0.z = VVar2.z;
  local_c0.z = local_f0.z;
  local_f0._0_8_ = VVar2._0_8_;
  local_c0.x = local_f0.x;
  local_c0.y = local_f0.y;
  VVar2 = operator/(&local_c0,local_44 + local_64 + local_84);
  local_f8 = VVar2.z;
  m0.x = local_f8;
  stack0xffffffffffffff00 = VVar2._0_8_;
  local_b0._0_4_ = m1.z;
  local_b0._4_4_ = fStack_fc;
  unique0x10000263 = VVar2;
  VVar2 = operator+(p2,pVStack_40);
  local_140.z = VVar2.z;
  local_130.z = local_140.z;
  local_140._0_8_ = VVar2._0_8_;
  local_130.x = local_140.x;
  local_130.y = local_140.y;
  VVar2 = operator*(&local_130,local_64);
  local_150.z = VVar2.z;
  local_120.z = local_150.z;
  local_150._0_8_ = VVar2._0_8_;
  local_120.x = local_150.x;
  local_120.y = local_150.y;
  VVar2 = operator/(&local_120,local_44 + local_64 + local_84);
  local_158 = VVar2.z;
  m1.x = local_158;
  stack0xfffffffffffffea0 = VVar2._0_8_;
  local_110._0_4_ = m2.z;
  local_110._4_4_ = fStack_15c;
  unique0x10000257 = VVar2;
  VVar2 = operator+(pVStack_40,p1);
  local_1a0.z = VVar2.z;
  local_190.z = local_1a0.z;
  local_1a0._0_8_ = VVar2._0_8_;
  local_190.x = local_1a0.x;
  local_190.y = local_1a0.y;
  local_1a0 = VVar2;
  VVar2 = operator*(&local_190,local_84);
  local_1b0.z = VVar2.z;
  local_180.z = local_1b0.z;
  local_1b0._0_8_ = VVar2._0_8_;
  local_180.x = local_1b0.x;
  local_180.y = local_1b0.y;
  local_1b0 = VVar2;
  VVar2 = operator/(&local_180,local_44 + local_64 + local_84);
  local_1c0.z = VVar2.z;
  m2.x = local_1c0.z;
  local_1c0._0_8_ = VVar2._0_8_;
  local_170._0_4_ = local_1c0.x;
  local_170._4_4_ = local_1c0.y;
  local_1c0 = VVar2;
  VVar2 = operator+((Vector3 *)local_b0,(Vector3 *)local_110);
  local_1e0.z = VVar2.z;
  local_1d0.z = local_1e0.z;
  local_1e0._0_8_ = VVar2._0_8_;
  local_1d0.x = local_1e0.x;
  local_1d0.y = local_1e0.y;
  VVar2 = operator+(&local_1d0,(Vector3 *)local_170);
  return VVar2;
}

Assistant:

Vector3 computeFaceCenter(uint32_t face) const
	{
		const Vector3 &p0 = m_positions[m_indices[face * 3 + 0]];
		const Vector3 &p1 = m_positions[m_indices[face * 3 + 1]];
		const Vector3 &p2 = m_positions[m_indices[face * 3 + 2]];
		const float l0 = length(p1 - p0);
		const float l1 = length(p2 - p1);
		const float l2 = length(p0 - p2);
		const Vector3 m0 = (p0 + p1) * l0 / (l0 + l1 + l2);
		const Vector3 m1 = (p1 + p2) * l1 / (l0 + l1 + l2);
		const Vector3 m2 = (p2 + p0) * l2 / (l0 + l1 + l2);
		return m0 + m1 + m2;
	}